

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall spirv_cross::Compiler::add_active_interface_variable(Compiler *this,uint32_t var_id)

{
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *this_00;
  uint32_t uVar1;
  SPIREntryPoint *pSVar2;
  TypedID<(spirv_cross::Types)2> *pTVar3;
  TypedID<(spirv_cross::Types)2> *pTVar4;
  pair<std::__detail::_Node_iterator<spirv_cross::TypedID<(spirv_cross::Types)2>,_true,_true>,_bool>
  pVar5;
  TypedID<(spirv_cross::Types)2> local_38;
  TypedID<(spirv_cross::Types)2> local_34;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *local_30;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *vars;
  undefined1 local_20;
  TypedID<(spirv_cross::Types)2> local_18;
  uint32_t local_14;
  Compiler *pCStack_10;
  uint32_t var_id_local;
  Compiler *this_local;
  
  local_14 = var_id;
  pCStack_10 = this;
  TypedID<(spirv_cross::Types)2>::TypedID(&local_18,var_id);
  pVar5 = ::std::
          unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
          ::insert(&this->active_interface_variables,&local_18);
  vars = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *)
         pVar5.first.super__Node_iterator_base<spirv_cross::TypedID<(spirv_cross::Types)2>,_true>.
         _M_cur;
  local_20 = pVar5.second;
  uVar1 = ParsedIR::get_spirv_version(&this->ir);
  if (0x103ff < uVar1) {
    pSVar2 = get_entry_point(this);
    local_30 = &pSVar2->interface_variables;
    pTVar3 = ::std::begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                       (local_30);
    pTVar4 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                       (local_30);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_34,local_14);
    pTVar3 = ::std::
             find<spirv_cross::TypedID<(spirv_cross::Types)2>*,spirv_cross::TypedID<(spirv_cross::Types)2>>
                       (pTVar3,pTVar4,&local_34);
    pTVar4 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                       (local_30);
    this_00 = local_30;
    if (pTVar3 == pTVar4) {
      TypedID<(spirv_cross::Types)2>::TypedID(&local_38,local_14);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::push_back(this_00,&local_38);
    }
  }
  return;
}

Assistant:

void Compiler::add_active_interface_variable(uint32_t var_id)
{
	active_interface_variables.insert(var_id);

	// In SPIR-V 1.4 and up we must also track the interface variable in the entry point.
	if (ir.get_spirv_version() >= 0x10400)
	{
		auto &vars = get_entry_point().interface_variables;
		if (find(begin(vars), end(vars), VariableID(var_id)) == end(vars))
			vars.push_back(var_id);
	}
}